

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall asl::String::fixW(String *this)

{
  int iVar1;
  int iVar2;
  int n;
  char *pcVar3;
  char *u;
  size_t sVar4;
  int offset;
  String *this_local;
  
  iVar1 = this->_len;
  iVar2 = this->_len;
  pcVar3 = str(this);
  u = str(this);
  n = cap(this);
  utf16toUtf8((wchar_t *)(pcVar3 + (int)(iVar1 + 1 + (4 - (iVar2 + 1U & 3) & 3))),u,n);
  pcVar3 = str(this);
  sVar4 = strlen(pcVar3);
  this->_len = (int)sVar4;
  return this;
}

Assistant:

String& String::fixW()
{
	int offset = (_len + 1) + ((4 - ((_len + 1) & 0x03)) & 0x03);
	to8bit((wchar_t*)(str() + offset), str(), cap());
	_len = (int)strlen(str());
	return *this;
}